

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManPrintQuit(Of_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  Gia_Man_t *pGVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int level;
  long lVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  timespec ts;
  timespec local_20;
  
  dVar8 = Gia_ManMemory(p->pGia);
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = ((float)pVVar1->nPageAlloc * 8.0 +
              (float)(pVVar1->iPage + 1) *
              (float)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) * (float)pVVar1->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  iVar6 = p->pGia->nObjs;
  dVar9 = p->CutCount[0];
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    p->CutCount[0] = 1.0;
    dVar9 = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar4 = (float)iVar6 * 32.0 * 9.536743e-07;
    fVar5 = (float)(p->vPages).nSize * 262144.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",dVar9);
    pGVar2 = p->pGia;
    printf("Merge = %.0f (%.1f)  ",p->CutCount[1],
           p->CutCount[1] / (double)(~(pGVar2->vCos->nSize + pGVar2->vCis->nSize) + pGVar2->nObjs));
    pGVar2 = p->pGia;
    printf("Eval = %.0f (%.1f)  ",p->CutCount[2],
           p->CutCount[2] / (double)(~(pGVar2->vCos->nSize + pGVar2->vCis->nSize) + pGVar2->nObjs));
    pGVar2 = p->pGia;
    printf("Cut = %.0f (%.1f)  ",p->CutCount[3],
           p->CutCount[3] / (double)(~(pGVar2->vCos->nSize + pGVar2->vCis->nSize) + pGVar2->nObjs));
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar8 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar4);
    printf("Cut = %.2f MB   ",(double)fVar5);
    if (p->pPars->fCutMin != 0) {
      printf("TT = %.2f MB  ",(double)fVar10);
    }
    printf("Total = %.2f MB   ",
           (double)((float)(dVar8 * 9.5367431640625e-07) + fVar4 + fVar5 + fVar10));
    level = 3;
    iVar6 = clock_gettime(3,&local_20);
    if (iVar6 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar3 = p->clkStart;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar7 - lVar3) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Of_ManPrintQuit( Of_Man_t * p )
{
    float MemGia  = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan  = 1.0 * sizeof(Of_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt   = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.1f)  ",    p->CutCount[1], 1.0*p->CutCount[1]/Gia_ManAndNum(p->pGia) );
    printf( "Eval = %.0f (%.1f)  ",     p->CutCount[2], 1.0*p->CutCount[2]/Gia_ManAndNum(p->pGia) );
    printf( "Cut = %.0f (%.1f)  ",      p->CutCount[3], 1.0*p->CutCount[3]/Gia_ManAndNum(p->pGia) );
//    printf( "Use = %.0f (%.1f)  ",      p->CutCount[4], 1.0*p->CutCount[4]/Gia_ManAndNum(p->pGia) );
//    printf( "Mat = %.0f (%.1f)  ",      p->CutCount[5], 1.0*p->CutCount[5]/Gia_ManAndNum(p->pGia) );
//    printf( "Equ = %d (%.2f %%)  ",     p->nCutUseAll,  100.0*p->nCutUseAll /p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    if ( p->pPars->fCutMin )
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB   ",       MemGia + MemMan + MemCuts + MemTt ); 
//    printf( "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}